

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::checkflipeligibility
          (tetgenmesh *this,int fliptype,point pa,point pb,point pc,point pd,point pe,int level,
          int edgepivot,flipconstraints *fc)

{
  point pa_00;
  point pb_00;
  point pc_00;
  int iVar1;
  long lVar2;
  uint uVar3;
  point pdVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  int types [2];
  double cosmaxd;
  point local_60;
  int poss [4];
  point tmppts [3];
  
  uVar3 = 0;
  local_60 = pc;
  if (fc->seg[0] != (point)0x0) {
    if (fliptype == 2) {
      if (this->dummypoint != pc) {
        iVar1 = tri_edge_test(this,pa,pb,pc,fc->seg[0],fc->seg[1],(point)0x0,1,types,poss);
        if (iVar1 == 4) {
          uVar3 = (uint)(types[0] == 8);
        }
        else {
          uVar3 = 0;
          if (iVar1 == 2) {
            uVar3 = (uint)(types[0] == 9);
          }
        }
      }
    }
    else if (fliptype == 1) {
      tmppts[0] = pa;
      tmppts[1] = pb;
      tmppts[2] = pc;
      uVar6 = 0;
      uVar3 = 0;
      do {
        uVar5 = uVar3;
        if (tmppts[uVar6] != this->dummypoint) {
          iVar1 = tri_edge_test(this,pe,pd,tmppts[uVar6],fc->seg[0],fc->seg[1],(point)0x0,1,types,
                                poss);
          if (iVar1 == 4) {
            if (types[0] == 8 && poss[0] == 0) {
              uVar5 = 1;
            }
          }
          else if (((iVar1 == 2) && (uVar5 = 1, types[0] != 9)) &&
                  (uVar5 = uVar3, types[0] == 8 && poss[0] == 0)) {
            uVar5 = 1;
          }
        }
        uVar3 = uVar5;
      } while ((uVar6 < 2) && (uVar6 = uVar6 + 1, uVar3 == 0));
    }
  }
  pc_00 = local_60;
  if ((fliptype == 1) && ((fc->fac[0] != (point)0x0 && (uVar3 == 0)))) {
    iVar1 = tri_edge_test(this,fc->fac[0],fc->fac[1],fc->fac[2],pe,pd,(point)0x0,1,types,poss);
    if (iVar1 == 2) {
      if ((types[0] & 0xfffffffeU) == 8) {
        uVar3 = 1;
      }
    }
    else if (iVar1 == 4) {
      lVar2 = 0;
      do {
        if ((types[lVar2] & 0xfffffffeU) == 8) {
          uVar3 = 1;
        }
      } while ((lVar2 == 0) && (lVar2 = 1, uVar3 == 0));
    }
  }
  pdVar4 = fc->remvert;
  uVar5 = 1;
  if (pdVar4 != pe && pdVar4 != pd) {
    uVar5 = uVar3;
  }
  if (uVar3 != 0) {
    uVar5 = uVar3;
  }
  if (pdVar4 == (point)0x0) {
    uVar5 = uVar3;
  }
  if (fliptype != 1) {
    uVar5 = uVar3;
  }
  if (fc->remove_large_angle == 0) {
    return uVar5;
  }
  if (uVar5 != 0) {
    return uVar5;
  }
  cosmaxd = 0.0;
  if (fliptype == 1) {
    pdVar4 = this->dummypoint;
    if (pdVar4 == pd) {
      return 0;
    }
    if (pdVar4 == pc_00) {
      return 0;
    }
    if (pdVar4 == pe) {
      return 0;
    }
    tetalldihedral(this,pe,pd,pb,pc_00,(double *)0x0,&cosmaxd,(double *)0x0);
    dVar7 = cosmaxd - fc->cosdihed_in;
    if (ABS(dVar7 / fc->cosdihed_in) < this->b->epsilon) {
      return 1;
    }
    if (dVar7 <= 0.0) {
      return 1;
    }
    pb = pe;
    pdVar4 = pa;
    if (cosmaxd < fc->cosdihed_out) {
      fc->cosdihed_out = cosmaxd;
    }
  }
  else {
    if (fliptype != 2) {
      return 0;
    }
    if (level != 0) {
      pdVar4 = this->dummypoint;
      pa_00 = pa;
      pb_00 = pb;
      if (edgepivot == 1) {
        pa_00 = pb;
        pb_00 = pa;
        pd = pe;
      }
      if (pdVar4 == pc_00 || (pdVar4 == pb || pdVar4 == pa)) {
        return 0;
      }
      tetalldihedral(this,pa_00,pb_00,pc_00,pd,(double *)0x0,&cosmaxd,(double *)0x0);
      dVar7 = cosmaxd - fc->cosdihed_in;
      if (ABS(dVar7 / fc->cosdihed_in) < this->b->epsilon) {
        return 1;
      }
      if (dVar7 <= 0.0) {
        return 1;
      }
      if (fc->cosdihed_out <= cosmaxd) {
        return 0;
      }
      fc->cosdihed_out = cosmaxd;
      return 0;
    }
    pdVar4 = this->dummypoint;
    if (pdVar4 == pc_00) {
      return 0;
    }
    if (pdVar4 == pa) {
      return 0;
    }
    if (pdVar4 == pb) {
      return 0;
    }
    tetalldihedral(this,pa,pb,pc_00,pd,(double *)0x0,&cosmaxd,(double *)0x0);
    dVar7 = cosmaxd - fc->cosdihed_in;
    if (ABS(dVar7 / fc->cosdihed_in) < this->b->epsilon) {
      return 1;
    }
    if (dVar7 <= 0.0) {
      return 1;
    }
    pd = pa;
    pdVar4 = pe;
    if (cosmaxd < fc->cosdihed_out) {
      fc->cosdihed_out = cosmaxd;
    }
  }
  iVar1 = 1;
  tetalldihedral(this,pb,pd,pc_00,pdVar4,(double *)0x0,&cosmaxd,(double *)0x0);
  dVar7 = cosmaxd - fc->cosdihed_in;
  if (((this->b->epsilon <= ABS(dVar7 / fc->cosdihed_in)) && (0.0 < dVar7)) &&
     (iVar1 = 0, cosmaxd < fc->cosdihed_out)) {
    fc->cosdihed_out = cosmaxd;
  }
  return iVar1;
}

Assistant:

int tetgenmesh::checkflipeligibility(int fliptype, point pa, point pb, 
                                     point pc, point pd, point pe,
                                     int level, int edgepivot,
                                     flipconstraints* fc)
{
  point tmppts[3];
  enum interresult dir;
  int types[2], poss[4];
  int intflag;
  int rejflag = 0;
  int i;

  if (fc->seg[0] != NULL) {
    // A constraining edge is given (e.g., for edge recovery).
    if (fliptype == 1) {
      // A 2-to-3 flip: [a,b,c] => [e,d,a], [e,d,b], [e,d,c].
      tmppts[0] = pa;
      tmppts[1] = pb;
      tmppts[2] = pc;
      for (i = 0; i < 3 && !rejflag; i++) {
        if (tmppts[i] != dummypoint) {
          // Test if the face [e,d,#] intersects the edge.
          intflag = tri_edge_test(pe, pd, tmppts[i], fc->seg[0], fc->seg[1], 
                                  NULL, 1, types, poss);
          if (intflag == 2) {
            // They intersect at a single point.
            dir = (enum interresult) types[0];
            if (dir == ACROSSFACE) {
              // The interior of [e,d,#] intersect the segment.
              rejflag = 1;
            } else if (dir == ACROSSEDGE) {
              if (poss[0] == 0) {
                // The interior of [e,d] intersect the segment.
                // Since [e,d] is the newly created edge. Reject this flip.
                rejflag = 1; 
              }
            }
          } else if (intflag == 4) {
            // They may intersect at either a point or a line segment.
            dir = (enum interresult) types[0];
            if (dir == ACROSSEDGE) {
              if (poss[0] == 0) {
                // The interior of [e,d] intersect the segment.
                // Since [e,d] is the newly created edge. Reject this flip.
                rejflag = 1;
              }
            }
          }
        } // if (tmppts[0] != dummypoint)
      } // i
    } else if (fliptype == 2) {
      // A 3-to-2 flip: [e,d,a], [e,d,b], [e,d,c] => [a,b,c]
      if (pc != dummypoint) {
        // Check if the new face [a,b,c] intersect the edge in its interior.
        intflag = tri_edge_test(pa, pb, pc, fc->seg[0], fc->seg[1], NULL, 
                                1, types, poss);
        if (intflag == 2) {
          // They intersect at a single point.
          dir = (enum interresult) types[0];
          if (dir == ACROSSFACE) {
            // The interior of [a,b,c] intersect the segment.
            rejflag = 1; // Do not flip.
          }
        } else if (intflag == 4) {
          // [a,b,c] is coplanar with the edge. 
          dir = (enum interresult) types[0];
          if (dir == ACROSSEDGE) {
            // The boundary of [a,b,c] intersect the segment.            
            rejflag = 1; // Do not flip.
          }
        }
      } // if (pc != dummypoint)
    }
  } // if (fc->seg[0] != NULL)

  if ((fc->fac[0] != NULL) && !rejflag) {
    // A constraining face is given (e.g., for face recovery).
    if (fliptype == 1) {
      // A 2-to-3 flip.
      // Test if the new edge [e,d] intersects the face.
      intflag = tri_edge_test(fc->fac[0], fc->fac[1], fc->fac[2], pe, pd, 
                              NULL, 1, types, poss);
      if (intflag == 2) {
        // They intersect at a single point.
        dir = (enum interresult) types[0];
        if (dir == ACROSSFACE) {
          rejflag = 1;
        } else if (dir == ACROSSEDGE) {
          rejflag = 1;
        } 
      } else if (intflag == 4) {
        // The edge [e,d] is coplanar with the face.
        // There may be two intersections.
        for (i = 0; i < 2 && !rejflag; i++) {
          dir = (enum interresult) types[i];
          if (dir == ACROSSFACE) {
            rejflag = 1;
          } else if (dir == ACROSSEDGE) {
            rejflag = 1;
          }
        }
      }
    } // if (fliptype == 1)
  } // if (fc->fac[0] != NULL)

  if ((fc->remvert != NULL) && !rejflag) {
    // The vertex is going to be removed. Do not create a new edge which
    //   contains this vertex.
    if (fliptype == 1) {
      // A 2-to-3 flip.
      if ((pd == fc->remvert) || (pe == fc->remvert)) {
        rejflag = 1;
      }
    }
  }

  if (fc->remove_large_angle && !rejflag) {
    // Remove a large dihedral angle. Do not create a new small angle.
    REAL cosmaxd = 0, diff;
    if (fliptype == 1) {
      // We assume that neither 'a' nor 'b' is dummypoint.
      // A 2-to-3 flip: [a,b,c] => [e,d,a], [e,d,b], [e,d,c].
      // The new tet [e,d,a,b] will be flipped later. Only two new tets:
      //   [e,d,b,c] and [e,d,c,a] need to be checked.
      if ((pc != dummypoint) && (pe != dummypoint) && (pd != dummypoint)) {
        // Get the largest dihedral angle of [e,d,b,c].
        tetalldihedral(pe, pd, pb, pc, NULL, &cosmaxd, NULL);
        diff = cosmaxd - fc->cosdihed_in;
        if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding.
        if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
          rejflag = 1;
        } else {
          // Record the largest new angle.
          if (cosmaxd < fc->cosdihed_out) {
            fc->cosdihed_out = cosmaxd; 
          }
          // Get the largest dihedral angle of [e,d,c,a].
          tetalldihedral(pe, pd, pc, pa, NULL, &cosmaxd, NULL);
          diff = cosmaxd - fc->cosdihed_in;
          if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding.
          if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
            rejflag = 1;
          } else {
            // Record the largest new angle.
            if (cosmaxd < fc->cosdihed_out) {
              fc->cosdihed_out = cosmaxd; 
            }
          }
        }
      } // if (pc != dummypoint && ...)
    } else if (fliptype == 2) {
      // A 3-to-2 flip: [e,d,a], [e,d,b], [e,d,c] => [a,b,c]
      // We assume that neither 'e' nor 'd' is dummypoint.
      if (level == 0) {
        // Both new tets [a,b,c,d] and [b,a,c,e] are new tets.
        if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
          // Get the largest dihedral angle of [a,b,c,d].
          tetalldihedral(pa, pb, pc, pd, NULL, &cosmaxd, NULL);
          diff = cosmaxd - fc->cosdihed_in;
          if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding
          if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
            rejflag = 1;
          } else {
            // Record the largest new angle.
            if (cosmaxd < fc->cosdihed_out) {
              fc->cosdihed_out = cosmaxd; 
            }
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pb, pa, pc, pe, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        }
      } else { // level > 0
        if (edgepivot == 1) {
          // The new tet [a,b,c,d] will be flipped. Only check [b,a,c,e].
          if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pb, pa, pc, pe, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        } else {
          // The new tet [b,a,c,e] will be flipped. Only check [a,b,c,d].
          if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pa, pb, pc, pd, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        } // edgepivot
      } // level
    }
  }

  return rejflag;
}